

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Abc_Nam_t * Acb_VerilogStartNames(void)

{
  Abc_Nam_t *p;
  char *pStr;
  int local_1c;
  int local_18;
  int fFound;
  int NameId;
  int i;
  Abc_Nam_t *pNames;
  
  _NameId = Abc_NamStart(100,0x10);
  fFound = 1;
  while( true ) {
    p = _NameId;
    if (0xd < fFound) {
      return _NameId;
    }
    pStr = Acb_Num2Name(fFound);
    local_18 = Abc_NamStrFindOrAdd(p,pStr,&local_1c);
    if ((fFound != local_18) || (local_1c != 0)) break;
    fFound = fFound + 1;
  }
  __assert_fail("i == NameId && !fFound",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0xb0,"Abc_Nam_t *Acb_VerilogStartNames()");
}

Assistant:

Abc_Nam_t * Acb_VerilogStartNames()
{
    Abc_Nam_t * pNames = Abc_NamStart( 100, 16 ); 
    int i, NameId, fFound;
    for ( i = 1; i < ACB_UNUSED; i++ )
    {
        NameId = Abc_NamStrFindOrAdd( pNames, Acb_Num2Name(i), &fFound );
        assert( i == NameId && !fFound );
    }
    return pNames;
}